

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O1

void adt_u32Set_insert(adt_u32Set_t *self,uint32_t val)

{
  adt_u32List_elem_t *paVar1;
  
  if (self != (adt_u32Set_t *)0x0) {
    paVar1 = adt_u32List_iter_last(&self->list);
    if ((paVar1 == (adt_u32List_elem_t *)0x0) || (paVar1->item < val)) {
      adt_u32List_insert(&self->list,val);
      return;
    }
    if (paVar1->item != val) {
      for (paVar1 = adt_u32List_iter_first(&self->list);
          (paVar1 != (adt_u32List_elem_t *)0x0 && (paVar1->item != val));
          paVar1 = adt_u32List_iter_next(paVar1)) {
        if (val < paVar1->item) {
          adt_u32List_insert_before(&self->list,paVar1,val);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void adt_u32Set_insert(adt_u32Set_t *self, uint32_t val)
{
   if (self != 0)
   {
      adt_u32List_elem_t *iter = adt_u32List_iter_last(&self->list);
      if ( (iter == 0) ||  (val > iter->item) )
      {
         adt_u32List_insert(&self->list, val);
      }
      else if (val != iter->item)
      {
         iter = adt_u32List_iter_first(&self->list);
         while (iter != 0)
         {
            if (val == iter->item)
            {
               break; //prevent duplicate
            }
            else if (val < iter->item)
            {
               adt_u32List_insert_before(&self->list, iter, val);
               break;
            }
            iter = adt_u32List_iter_next(iter);
         }
      }
   }
}